

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O0

bool __thiscall
cmMathCommand::HandleExprCommand
          (cmMathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmExprParserHelper *this_00;
  int iVar1;
  uint uVar2;
  size_type sVar3;
  const_reference name;
  const_reference __rhs;
  char *pcVar4;
  char local_538 [8];
  char buffer [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string e;
  cmExprParserHelper helper;
  string *expression;
  string *outputVariable;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMathCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 3) {
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,1);
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_20,2);
    this_00 = (cmExprParserHelper *)((long)&e.field_2 + 8);
    cmExprParserHelper::cmExprParserHelper(this_00);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar1 = cmExprParserHelper::ParseString(this_00,pcVar4,0);
    if (iVar1 == 0) {
      std::operator+(&local_128,"cannot parse the expression: \"",__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128,"\": ");
      std::__cxx11::string::~string((string *)&local_128);
      pcVar4 = cmExprParserHelper::GetError((cmExprParserHelper *)((long)&e.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_108,pcVar4);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_108);
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_108);
    }
    else {
      uVar2 = cmExprParserHelper::GetResult((cmExprParserHelper *)((long)&e.field_2 + 8));
      sprintf(local_538,"%d",(ulong)uVar2);
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,local_538);
      this_local._7_1_ = 1;
    }
    cmExprParserHelper::~cmExprParserHelper((cmExprParserHelper *)((long)&e.field_2 + 8));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"EXPR called with incorrect arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMathCommand::HandleExprCommand(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("EXPR called with incorrect arguments.");
    return false;
  }

  const std::string& outputVariable = args[1];
  const std::string& expression = args[2];

  cmExprParserHelper helper;
  if (!helper.ParseString(expression.c_str(), 0)) {
    std::string e = "cannot parse the expression: \"" + expression + "\": ";
    e += helper.GetError();
    this->SetError(e);
    return false;
  }

  char buffer[1024];
  sprintf(buffer, "%d", helper.GetResult());

  this->Makefile->AddDefinition(outputVariable, buffer);
  return true;
}